

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void google::protobuf::TestUtil::SetOneof2<proto2_unittest::TestOneof2>(TestOneof2 *message)

{
  bool bVar1;
  Arena *arena;
  string_view value;
  
  if ((message->field_0)._impl_._oneof_case_[0] != 1) {
    proto2_unittest::TestOneof2::clear_foo(message);
    (message->field_0)._impl_._oneof_case_[0] = 1;
  }
  *(undefined4 *)((long)&message->field_0 + 0x18) = 200;
  bVar1 = protobuf::internal::ValidateEnum
                    (3,(uint32_t *)&proto2_unittest::TestOneof2_NestedEnum_internal_data_);
  if (bVar1) {
    if ((message->field_0)._impl_._oneof_case_[1] != 0x11) {
      proto2_unittest::TestOneof2::clear_bar(message);
      (message->field_0)._impl_._oneof_case_[1] = 0x11;
    }
    *(undefined4 *)((long)&message->field_0 + 0x20) = 3;
    (message->field_0)._impl_.baz_int_ = 0xca;
    *(byte *)&message->field_0 = *(byte *)&message->field_0 | 3;
    arena = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    value._M_str = "203";
    value._M_len = 3;
    protobuf::internal::ArenaStringPtr::Set(&(message->field_0)._impl_.baz_string_,value,arena);
    return;
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestOneof2_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                ,0xf972,
                "void proto2_unittest::TestOneof2::set_bar_enum(::proto2_unittest::TestOneof2_NestedEnum)"
               );
}

Assistant:

void SetOneof2(TestOneof2* message) {
  message->set_foo_int(200);
  message->set_bar_enum(TestOneof2::BAZ);
  message->set_baz_int(202);
  message->set_baz_string("203");
}